

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O0

Shader * __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::Program::addShader
          (Program *this,ShaderType type,GLSLVersion version)

{
  size_type sVar1;
  Shader *this_00;
  Shader *local_20;
  Shader *shader;
  GLSLVersion version_local;
  ShaderType type_local;
  Program *this_local;
  
  shader._0_4_ = version;
  shader._4_4_ = type;
  _version_local = this;
  sVar1 = std::
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
          ::size(&this->m_shaders);
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::reserve(&this->m_shaders,sVar1 + 1);
  this_00 = (Shader *)operator_new(0x38);
  Shader::Shader(this_00,shader._4_4_,(GLSLVersion)shader);
  local_20 = this_00;
  std::
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  ::push_back(&this->m_shaders,&local_20);
  return local_20;
}

Assistant:

Shader* Program::addShader (glu::ShaderType type, glu::GLSLVersion version)
{
	DE_ASSERT(type < glu::SHADERTYPE_LAST);

	Shader* shader;

	// make sure push_back() cannot throw
	m_shaders.reserve(m_shaders.size() + 1);

	shader = new Shader(type, version);
	m_shaders.push_back(shader);

	return shader;
}